

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O1

string * __thiscall
libtorrent::peer_disconnected_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,peer_disconnected_alert *this)

{
  undefined8 uVar1;
  error_category *peVar2;
  _Alloc_hider _Var3;
  int iVar4;
  undefined4 extraout_var;
  size_t sVar5;
  char *pcVar6;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  char buf [600];
  
  peer_alert::message_abi_cxx11_(&local_2c8,&this->super_peer_alert);
  _Var3._M_p = local_2c8._M_dataplus._M_p;
  if ((ulong)this->op < 0x2b) {
    pcVar6 = operation_name::names[this->op];
  }
  else {
    pcVar6 = "unknown operation";
  }
  uVar1 = *(undefined8 *)
           ((anonymous_namespace)::socket_type_str +
           (long)*(int *)&(this->super_peer_alert).field_0x9c * 8);
  iVar4 = (**((this->error).cat_)->_vptr_error_category)();
  peVar2 = (this->error).cat_;
  (*peVar2->_vptr_error_category[4])(&local_2e8,peVar2,(ulong)(uint)(this->error).val_);
  convert_from_native(&local_2a8,&local_2e8);
  snprintf(buf,600,"%s disconnecting (%s) [%s] [%s]: %s (reason: %d)",_Var3._M_p,uVar1,pcVar6,
           CONCAT44(extraout_var,iVar4),local_2a8._M_dataplus._M_p,(ulong)this->reason);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar5 = strlen(buf);
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,buf,buf + sVar5);
  return __return_storage_ptr__;
}

Assistant:

std::string peer_disconnected_alert::message() const
	{
		char buf[600];
		std::snprintf(buf, sizeof(buf), "%s disconnecting (%s) [%s] [%s]: %s (reason: %d)"
			, peer_alert::message().c_str()
			, socket_type_str[socket_type]
			, operation_name(op), error.category().name()
			, convert_from_native(error.message()).c_str()
			, int(reason));
		return buf;
	}